

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::core::AbstractTransaction::RemoveTxIn(AbstractTransaction *this,uint32_t index)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  int local_18;
  uint32_t local_14;
  int ret;
  uint32_t index_local;
  AbstractTransaction *this_local;
  
  local_14 = index;
  _ret = this;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)index,0x175,"RemoveTxIn");
  local_18 = wally_tx_remove_input(this->wally_tx_pointer_,local_14);
  if (local_18 != 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x17a;
    local_30.funcname = "RemoveTxIn";
    logger::warn<int&>(&local_30,"wally_tx_remove_input NG[{}].",&local_18);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"txin remove error.",&local_51);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void AbstractTransaction::RemoveTxIn(uint32_t index) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);

  int ret = wally_tx_remove_input(
      static_cast<struct wally_tx *>(wally_tx_pointer_), index);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_remove_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin remove error.");
  }
}